

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* parse_script_arg(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *__return_storage_ptr__,string *arg,string *fname,string *err)

{
  string *psVar1;
  string *psVar2;
  size_type sVar3;
  undefined1 auVar4 [8];
  _Alloc_hider _Var5;
  uint uVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  istream *piVar12;
  long *plVar13;
  size_type *extraout_RAX;
  size_type *psVar14;
  undefined8 *puVar15;
  uint uVar16;
  undefined8 uVar17;
  long *plVar18;
  pointer pbVar19;
  ulong *puVar20;
  ulong uVar21;
  size_type *psVar22;
  pointer pcVar23;
  uint __len;
  ulong uVar24;
  uint __val;
  size_type sVar25;
  undefined1 uVar26;
  bool bVar27;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 uVar28;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 uVar29;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined1 local_530 [8];
  string val;
  string local_328;
  string local_308;
  string local_2e8;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  long *local_2a8;
  long local_2a0;
  long local_298;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  long *local_288;
  long local_280;
  long local_278;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  long *local_268;
  long local_260;
  long local_258;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  long *local_248;
  long local_240;
  long local_238;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  long *local_228;
  long local_220;
  long local_218;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  string local_208;
  string local_1e8;
  string local_1c8;
  long *local_1a8;
  long local_1a0;
  long local_198;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  long *local_188;
  long local_180;
  long local_178;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined1 local_168 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  long local_140;
  ulong local_138;
  ulong local_128;
  ulong local_120;
  undefined1 auStack_118 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arr;
  undefined1 local_f0 [8];
  string index;
  ulong local_c0;
  long lStack_b8;
  undefined1 local_b0 [8];
  string line;
  undefined1 local_80 [8];
  string def;
  string element;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (*(arg->_M_dataplus)._M_p == '\"') {
    readQuote((string *)local_530,arg);
    if (val._M_dataplus._M_p != (pointer)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_530);
    }
    if (local_530 == (undefined1  [8])&val._M_string_length) {
      return __return_storage_ptr__;
    }
    operator_delete((void *)local_530);
    return __return_storage_ptr__;
  }
  lVar11 = std::__cxx11::string::find((char *)arg,0x1354dd,0);
  line.field_2._8_8_ = err;
  if (lVar11 == -1) {
    lVar11 = std::__cxx11::string::find((char *)arg,0x136167,0);
    if ((lVar11 != -1) &&
       (lVar11 = std::__cxx11::string::find((char *)arg,0x135e16,0), lVar11 != -1)) {
      iVar8 = std::__cxx11::string::find((char *)arg,0x136167,0);
      iVar9 = std::__cxx11::string::find((char *)arg,0x135e16,0);
      std::__cxx11::string::substr((ulong)&local_308,(ulong)arg);
      trimSpaces((string *)local_f0,&local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
      if ((iVar8 + 1 == iVar9) || (index._M_dataplus._M_p == (pointer)0x0)) {
        std::__cxx11::string::find((char *)arg,0x136167,0);
        std::__cxx11::string::substr((ulong)local_530,(ulong)arg);
        uVar17 = line.field_2._8_8_;
        plVar13 = (long *)std::__cxx11::string::replace((ulong)local_530,0,(char *)0x0,0x1367ba);
        local_80 = (undefined1  [8])&def._M_string_length;
        psVar14 = (size_type *)(plVar13 + 2);
        if ((size_type *)*plVar13 == psVar14) {
          def._M_string_length = *psVar14;
          def.field_2._M_allocated_capacity = plVar13[3];
        }
        else {
          def._M_string_length = *psVar14;
          local_80 = (undefined1  [8])*plVar13;
        }
        def._M_dataplus._M_p = (pointer)plVar13[1];
        *plVar13 = (long)psVar14;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        if (local_530 != (undefined1  [8])&val._M_string_length) {
          operator_delete((void *)local_530);
        }
        std::ifstream::ifstream(local_530,(string *)fname,_S_in);
        cVar7 = std::__basic_file<char>::is_open();
        if (cVar7 == '\0') {
LAB_0012d395:
          std::ifstream::close();
          def.field_2._8_8_ = &element._M_string_length;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)((long)&def.field_2 + 8),*(long *)uVar17,
                     *(long *)(uVar17 + 8) + *(long *)uVar17);
          std::__cxx11::string::append(def.field_2._M_local_buf + 8);
          plVar13 = (long *)std::__cxx11::string::_M_append
                                      (def.field_2._M_local_buf + 8,(ulong)(arg->_M_dataplus)._M_p);
          psVar14 = (size_type *)(plVar13 + 2);
          if ((size_type *)*plVar13 == psVar14) {
            line._M_string_length = *psVar14;
            line.field_2._M_allocated_capacity = plVar13[3];
            local_b0 = (undefined1  [8])&line._M_string_length;
          }
          else {
            line._M_string_length = *psVar14;
            local_b0 = (undefined1  [8])*plVar13;
          }
          line._M_dataplus._M_p = (pointer)plVar13[1];
          *plVar13 = (long)psVar14;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::append(local_b0);
          plVar18 = plVar13 + 2;
          if ((long *)*plVar13 == plVar18) {
            uVar28 = (undefined4)*plVar18;
            uVar29 = *(undefined4 *)((long)plVar13 + 0x14);
            local_258 = *plVar18;
            uStack_250 = (undefined4)plVar13[3];
            uStack_24c = *(undefined4 *)((long)plVar13 + 0x1c);
            local_268 = &local_258;
          }
          else {
            local_258 = *plVar18;
            uVar28 = extraout_XMM0_Da_06;
            uVar29 = extraout_XMM0_Db_06;
            local_268 = (long *)*plVar13;
          }
          local_260 = plVar13[1];
          *plVar13 = (long)plVar18;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          log((double)CONCAT44(uVar29,uVar28));
          if (local_268 != &local_258) {
            operator_delete(local_268);
          }
          if (local_b0 != (undefined1  [8])&line._M_string_length) {
            operator_delete((void *)local_b0);
          }
          if ((size_type *)def.field_2._8_8_ != &element._M_string_length) {
            operator_delete((void *)def.field_2._8_8_);
          }
          uVar21 = 1;
        }
        else {
          local_b0 = (undefined1  [8])&line._M_string_length;
          line._M_dataplus._M_p = (pointer)0x0;
          line._M_string_length = line._M_string_length & 0xffffffffffffff00;
          __val = 0;
          psVar1 = (string *)(def.field_2._M_local_buf + 8);
          local_120 = local_120 & 0xffffffff00000000;
          local_128 = local_128 & 0xffffffff00000000;
          do {
            do {
              do {
                cVar7 = std::ios::widen((char)*(undefined8 *)((long)local_530 + -0x18) +
                                        (char)(istream *)local_530);
                piVar12 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                    ((istream *)local_530,(string *)local_b0,cVar7);
                uVar26 = '\x01';
                if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) != 0)
                goto LAB_0012d363;
                local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1e8,local_b0,line._M_dataplus._M_p + (long)local_b0);
                trimSpaces(psVar1,&local_1e8);
                std::__cxx11::string::operator=((string *)local_b0,(string *)psVar1);
                if ((size_type *)def.field_2._8_8_ != &element._M_string_length) {
                  operator_delete((void *)def.field_2._8_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                  operator_delete(local_1e8._M_dataplus._M_p);
                }
                lVar11 = std::__cxx11::string::find(local_b0,0x1352c2,0);
                __val = __val + 1;
              } while (lVar11 == 0);
              lVar11 = std::__cxx11::string::find(local_b0,(ulong)local_80,0);
              uVar16 = (uint)local_120 & 0xff;
              if (lVar11 != -1) {
                uVar16 = 1;
              }
              local_120 = CONCAT44(local_120._4_4_,uVar16);
            } while ((uVar16 & 1) == 0);
            iVar9 = 0;
            iVar8 = std::__cxx11::string::find((char *)local_b0,0x1367c2,0);
            element.field_2._M_local_buf[0xf] = iVar8 == -1;
            if (!(bool)element.field_2._M_local_buf[0xf]) {
              std::__cxx11::string::substr((ulong)psVar1,(ulong)local_b0);
              std::__cxx11::string::operator=((string *)local_b0,(string *)psVar1);
              if ((size_type *)def.field_2._8_8_ != &element._M_string_length) {
                operator_delete((void *)def.field_2._8_8_);
              }
              iVar8 = std::__cxx11::string::find((char *)local_b0,0x1361a9,0);
              if (iVar8 == -1) {
                local_168 = (undefined1  [8])&__str_2._M_string_length;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_168,*(long *)line.field_2._8_8_,
                           *(long *)(line.field_2._8_8_ + 8) + *(long *)line.field_2._8_8_);
                std::__cxx11::string::append((char *)local_168);
                plVar13 = (long *)std::__cxx11::string::_M_append
                                            ((char *)local_168,(ulong)(arg->_M_dataplus)._M_p);
                auStack_118 = (undefined1  [8])
                              &arr.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                pbVar19 = (pointer)(plVar13 + 2);
                if ((pointer)*plVar13 == pbVar19) {
                  arr.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(pbVar19->_M_dataplus)._M_p;
                  arr.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)plVar13[3];
                }
                else {
                  arr.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(pbVar19->_M_dataplus)._M_p;
                  auStack_118 = (undefined1  [8])*plVar13;
                }
                arr.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar13[1];
                *plVar13 = (long)pbVar19;
                plVar13[1] = 0;
                *(undefined1 *)(plVar13 + 2) = 0;
                puVar15 = (undefined8 *)std::__cxx11::string::append(auStack_118);
                index.field_2._8_8_ = &stack0xffffffffffffff40;
                puVar20 = puVar15 + 2;
                if ((ulong *)*puVar15 == puVar20) {
                  local_c0 = *puVar20;
                  lStack_b8 = puVar15[3];
                }
                else {
                  local_c0 = *puVar20;
                  index.field_2._8_8_ = (ulong *)*puVar15;
                }
                lVar11 = puVar15[1];
                *puVar15 = puVar20;
                puVar15[1] = 0;
                *(undefined1 *)(puVar15 + 2) = 0;
                uVar16 = -__val;
                if (0 < (int)__val) {
                  uVar16 = __val;
                }
                __len = 1;
                if (9 < uVar16) {
                  uVar21 = (ulong)uVar16;
                  uVar6 = 4;
                  do {
                    __len = uVar6;
                    uVar10 = (uint)uVar21;
                    if (uVar10 < 100) {
                      __len = __len - 2;
                      goto LAB_0012ceb1;
                    }
                    if (uVar10 < 1000) {
                      __len = __len - 1;
                      goto LAB_0012ceb1;
                    }
                    if (uVar10 < 10000) goto LAB_0012ceb1;
                    uVar21 = uVar21 / 10000;
                    uVar6 = __len + 4;
                  } while (99999 < uVar10);
                  __len = __len + 1;
                }
LAB_0012ceb1:
                __str_2.field_2._8_8_ = &stack0xfffffffffffffec8;
                std::__cxx11::string::_M_construct
                          ((ulong)((long)&__str_2.field_2 + 8),
                           (char)__len - (char)((int)__val >> 0x1f));
                std::__detail::__to_chars_10_impl<unsigned_int>
                          ((char *)((ulong)(__val >> 0x1f) + __str_2.field_2._8_8_),__len,uVar16);
                uVar21 = 0xf;
                if ((ulong *)index.field_2._8_8_ != &stack0xffffffffffffff40) {
                  uVar21 = local_c0;
                }
                psVar14 = &element._M_string_length;
                if (uVar21 < (ulong)(local_140 + lVar11)) {
                  uVar21 = 0xf;
                  if ((ulong *)__str_2.field_2._8_8_ != &stack0xfffffffffffffec8) {
                    uVar21 = local_138;
                  }
                  if (uVar21 < (ulong)(local_140 + lVar11)) goto LAB_0012cf4a;
                  puVar15 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)((long)&__str_2.field_2 + 8),0,(char *)0x0,
                                       index.field_2._8_8_);
                  def.field_2._8_8_ = *puVar15;
                  psVar22 = puVar15 + 2;
                  if ((size_type *)def.field_2._8_8_ != psVar22) goto LAB_0012cf9a;
                  element._M_string_length = *psVar22;
                  element.field_2._M_allocated_capacity = puVar15[3];
                  def.field_2._8_8_ = psVar14;
                }
                else {
LAB_0012cf4a:
                  puVar15 = (undefined8 *)
                            std::__cxx11::string::_M_append
                                      (index.field_2._M_local_buf + 8,__str_2.field_2._8_8_);
                  def.field_2._8_8_ = *puVar15;
                  psVar22 = puVar15 + 2;
                  if ((size_type *)def.field_2._8_8_ == psVar22) {
                    element._M_string_length = *psVar22;
                    element.field_2._M_allocated_capacity = puVar15[3];
                    def.field_2._8_8_ = psVar14;
                  }
                  else {
LAB_0012cf9a:
                    element._M_string_length = *psVar22;
                  }
                }
                element._M_dataplus._M_p = (pointer)puVar15[1];
                *puVar15 = psVar22;
                puVar15[1] = 0;
                *(undefined1 *)psVar22 = 0;
                plVar13 = (long *)std::__cxx11::string::append((char *)psVar1);
                local_1a8 = &local_198;
                plVar18 = plVar13 + 2;
                if ((long *)*plVar13 == plVar18) {
                  uVar28 = (undefined4)*plVar18;
                  uVar29 = *(undefined4 *)((long)plVar13 + 0x14);
                  local_198 = *plVar18;
                  uStack_190 = (undefined4)plVar13[3];
                  uStack_18c = *(undefined4 *)((long)plVar13 + 0x1c);
                }
                else {
                  local_198 = *plVar18;
                  uVar28 = extraout_XMM0_Da_03;
                  uVar29 = extraout_XMM0_Db_03;
                  local_1a8 = (long *)*plVar13;
                }
                local_1a0 = plVar13[1];
                *plVar13 = (long)plVar18;
                plVar13[1] = 0;
                *(undefined1 *)(plVar13 + 2) = 0;
                log((double)CONCAT44(uVar29,uVar28));
                if (local_1a8 != &local_198) {
                  operator_delete(local_1a8);
                }
                if ((size_type *)def.field_2._8_8_ != psVar14) {
                  operator_delete((void *)def.field_2._8_8_);
                }
                if ((ulong *)__str_2.field_2._8_8_ != &stack0xfffffffffffffec8) {
                  operator_delete((void *)__str_2.field_2._8_8_);
                }
                if ((ulong *)index.field_2._8_8_ != &stack0xffffffffffffff40) {
                  operator_delete((void *)index.field_2._8_8_);
                }
                if (auStack_118 !=
                    (undefined1  [8])
                    &arr.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) {
                  operator_delete((void *)auStack_118);
                }
                if (local_168 != (undefined1  [8])&__str_2._M_string_length) {
                  operator_delete((void *)local_168);
                }
                iVar9 = 0xd;
              }
              else {
                std::__cxx11::string::substr((ulong)&local_2e8,(ulong)local_b0);
                trimSpaces(psVar1,&local_2e8);
                std::__cxx11::string::operator=((string *)local_b0,(string *)psVar1);
                if ((size_type *)def.field_2._8_8_ != &element._M_string_length) {
                  operator_delete((void *)def.field_2._8_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                  operator_delete(local_2e8._M_dataplus._M_p);
                }
                lVar11 = std::__cxx11::string::find(local_b0,0x135972,0);
                if (lVar11 == -1) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_168,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)line.field_2._8_8_,
                                 "\t Reason: Failed to parse return value for \'");
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)auStack_118,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_168,arg);
                  plVar13 = (long *)std::__cxx11::string::append(auStack_118);
                  index.field_2._8_8_ = &stack0xffffffffffffff40;
                  puVar20 = (ulong *)(plVar13 + 2);
                  if ((ulong *)*plVar13 == puVar20) {
                    local_c0 = *puVar20;
                    lStack_b8 = plVar13[3];
                  }
                  else {
                    local_c0 = *puVar20;
                    index.field_2._8_8_ = (ulong *)*plVar13;
                  }
                  *plVar13 = (long)puVar20;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  std::__cxx11::to_string((string *)((long)&__str_2.field_2 + 8),__val);
                  std::operator+(psVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&index.field_2 + 8),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&__str_2.field_2 + 8));
                  plVar13 = (long *)std::__cxx11::string::append((char *)psVar1);
                  local_188 = &local_178;
                  plVar18 = plVar13 + 2;
                  if ((long *)*plVar13 == plVar18) {
                    uVar28 = (undefined4)*plVar18;
                    uVar29 = *(undefined4 *)((long)plVar13 + 0x14);
                    local_178 = *plVar18;
                    uStack_170 = (undefined4)plVar13[3];
                    uStack_16c = *(undefined4 *)((long)plVar13 + 0x1c);
                  }
                  else {
                    local_178 = *plVar18;
                    uVar28 = extraout_XMM0_Da_02;
                    uVar29 = extraout_XMM0_Db_02;
                    local_188 = (long *)*plVar13;
                  }
                  local_180 = plVar13[1];
                  *plVar13 = (long)plVar18;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  log((double)CONCAT44(uVar29,uVar28));
                  if (local_188 != &local_178) {
                    operator_delete(local_188);
                  }
                  if ((size_type *)def.field_2._8_8_ != &element._M_string_length) {
                    operator_delete((void *)def.field_2._8_8_);
                  }
                  if ((ulong *)__str_2.field_2._8_8_ != &stack0xfffffffffffffec8) {
                    operator_delete((void *)__str_2.field_2._8_8_);
                  }
                  if ((ulong *)index.field_2._8_8_ != &stack0xffffffffffffff40) {
                    operator_delete((void *)index.field_2._8_8_);
                  }
                  if (auStack_118 !=
                      (undefined1  [8])
                      &arr.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish) {
                    operator_delete((void *)auStack_118);
                  }
                  if (local_168 != (undefined1  [8])&__str_2._M_string_length) {
                    operator_delete((void *)local_168);
                  }
                  iVar9 = 0xd;
                }
                else {
                  std::ifstream::close();
                  readQuote(psVar1,(string *)local_b0);
                  if (element._M_dataplus._M_p != (pointer)0x0) {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(__return_storage_ptr__,psVar1);
                  }
                  psVar14 = &element._M_string_length;
                  if ((size_type *)def.field_2._8_8_ != psVar14) {
                    operator_delete((void *)def.field_2._8_8_);
                    psVar14 = extraout_RAX;
                  }
                  local_128 = CONCAT44(local_128._4_4_,(int)CONCAT71((int7)((ulong)psVar14 >> 8),1))
                  ;
                  iVar9 = 1;
                }
              }
            }
          } while (iVar9 == 0);
          uVar26 = element.field_2._M_local_buf[0xf];
          if (iVar9 == 0xd) {
            uVar26 = '\x01';
          }
LAB_0012d363:
          uVar21 = local_128 & 0xffffffff;
          if (local_b0 != (undefined1  [8])&line._M_string_length) {
            operator_delete((void *)local_b0);
          }
          uVar17 = line.field_2._8_8_;
          if (uVar26 != '\0') goto LAB_0012d395;
        }
        std::ifstream::~ifstream(local_530);
        if (local_80 != (undefined1  [8])&def._M_string_length) {
          operator_delete((void *)local_80);
        }
      }
      else {
        local_80 = (undefined1  [8])&def._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_80,*(long *)line.field_2._8_8_,
                   *(long *)(line.field_2._8_8_ + 8) + *(long *)line.field_2._8_8_);
        std::__cxx11::string::append(local_80);
        plVar13 = (long *)std::__cxx11::string::_M_append(local_80,(ulong)(arg->_M_dataplus)._M_p);
        psVar14 = (size_type *)(plVar13 + 2);
        if ((size_type *)*plVar13 == psVar14) {
          val._M_string_length = *psVar14;
          val.field_2._M_allocated_capacity = plVar13[3];
          local_530 = (undefined1  [8])&val._M_string_length;
        }
        else {
          val._M_string_length = *psVar14;
          local_530 = (undefined1  [8])*plVar13;
        }
        val._M_dataplus._M_p = (pointer)plVar13[1];
        *plVar13 = (long)psVar14;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append(local_530);
        plVar18 = plVar13 + 2;
        if ((long *)*plVar13 == plVar18) {
          uVar28 = (undefined4)*plVar18;
          uVar29 = *(undefined4 *)((long)plVar13 + 0x14);
          local_278 = *plVar18;
          uStack_270 = (undefined4)plVar13[3];
          uStack_26c = *(undefined4 *)((long)plVar13 + 0x1c);
          local_288 = &local_278;
        }
        else {
          local_278 = *plVar18;
          uVar28 = extraout_XMM0_Da_04;
          uVar29 = extraout_XMM0_Db_04;
          local_288 = (long *)*plVar13;
        }
        local_280 = plVar13[1];
        *plVar13 = (long)plVar18;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        log((double)CONCAT44(uVar29,uVar28));
        if (local_288 != &local_278) {
          operator_delete(local_288);
        }
        if (local_530 != (undefined1  [8])&val._M_string_length) {
          operator_delete((void *)local_530);
        }
        if (local_80 != (undefined1  [8])&def._M_string_length) {
          operator_delete((void *)local_80);
        }
        uVar21 = 1;
      }
      if (local_f0 != (undefined1  [8])&index._M_string_length) {
        operator_delete((void *)local_f0);
      }
      goto LAB_0012d2be;
    }
    sVar3 = arg->_M_string_length;
    if (sVar3 != 0) {
      pcVar23 = (arg->_M_dataplus)._M_p;
      sVar25 = 0;
      do {
        cVar7 = pcVar23[sVar25];
        iVar9 = (int)cVar7;
        iVar8 = isalpha(iVar9);
        if ((((iVar9 != 0x3a) && (cVar7 != '_')) && (iVar8 == 0)) && (9 < iVar9 - 0x30U)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)line.field_2._8_8_,"\t Reason: argument \'");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_530,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0,arg);
          plVar13 = (long *)std::__cxx11::string::append(local_530);
          plVar18 = plVar13 + 2;
          if ((long *)*plVar13 == plVar18) {
            uVar28 = (undefined4)*plVar18;
            uVar29 = *(undefined4 *)((long)plVar13 + 0x14);
            local_238 = *plVar18;
            uStack_230 = (undefined4)plVar13[3];
            uStack_22c = *(undefined4 *)((long)plVar13 + 0x1c);
            local_248 = &local_238;
          }
          else {
            local_238 = *plVar18;
            uVar28 = extraout_XMM0_Da_00;
            uVar29 = extraout_XMM0_Db_00;
            local_248 = (long *)*plVar13;
          }
          local_240 = plVar13[1];
          *plVar13 = (long)plVar18;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          log((double)CONCAT44(uVar29,uVar28));
          if (local_248 != &local_238) {
            operator_delete(local_248);
          }
          if (local_530 != (undefined1  [8])&val._M_string_length) {
            operator_delete((void *)local_530);
          }
          if (local_f0 != (undefined1  [8])&index._M_string_length) {
            operator_delete((void *)local_f0);
          }
          uVar21 = 1;
          bVar27 = false;
          goto LAB_0012d2b9;
        }
        sVar25 = sVar25 + 1;
      } while (sVar3 != sVar25);
    }
    lVar11 = std::__cxx11::string::find((char *)arg,0x136884,0);
    if (lVar11 != -1) {
      std::__cxx11::string::find((char *)arg,0x136884,0);
      std::__cxx11::string::substr((ulong)local_530,(ulong)arg);
      std::__cxx11::string::operator=((string *)arg,(string *)local_530);
      if (local_530 != (undefined1  [8])&val._M_string_length) {
        operator_delete((void *)local_530);
      }
    }
    std::ifstream::ifstream((istream *)local_530,(string *)fname,_S_in);
    cVar7 = std::__basic_file<char>::is_open();
    if (cVar7 == '\0') {
LAB_0012c692:
      std::ifstream::close();
      local_80 = (undefined1  [8])&def._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,*(long *)line.field_2._8_8_,
                 *(long *)(line.field_2._8_8_ + 8) + *(long *)line.field_2._8_8_);
      std::__cxx11::string::append(local_80);
      plVar13 = (long *)std::__cxx11::string::_M_append(local_80,(ulong)(arg->_M_dataplus)._M_p);
      psVar14 = (size_type *)(plVar13 + 2);
      if ((size_type *)*plVar13 == psVar14) {
        index._M_string_length = *psVar14;
        index.field_2._M_allocated_capacity = plVar13[3];
        local_f0 = (undefined1  [8])&index._M_string_length;
      }
      else {
        index._M_string_length = *psVar14;
        local_f0 = (undefined1  [8])*plVar13;
      }
      index._M_dataplus._M_p = (pointer)plVar13[1];
      *plVar13 = (long)psVar14;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::append(local_f0);
      plVar18 = plVar13 + 2;
      if ((long *)*plVar13 == plVar18) {
        uVar28 = (undefined4)*plVar18;
        uVar29 = *(undefined4 *)((long)plVar13 + 0x14);
        local_218 = *plVar18;
        uStack_210 = (undefined4)plVar13[3];
        uStack_20c = *(undefined4 *)((long)plVar13 + 0x1c);
        local_228 = &local_218;
      }
      else {
        local_218 = *plVar18;
        uVar28 = extraout_XMM0_Da_01;
        uVar29 = extraout_XMM0_Db_01;
        local_228 = (long *)*plVar13;
      }
      local_220 = plVar13[1];
      *plVar13 = (long)plVar18;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      log((double)CONCAT44(uVar29,uVar28));
      if (local_228 != &local_218) {
        operator_delete(local_228);
      }
      if (local_f0 != (undefined1  [8])&index._M_string_length) {
        operator_delete((void *)local_f0);
      }
      if (local_80 != (undefined1  [8])&def._M_string_length) {
        operator_delete((void *)local_80);
      }
      bVar27 = true;
      uVar21 = 0;
    }
    else {
      local_f0 = (undefined1  [8])&index._M_string_length;
      index._M_dataplus._M_p = (pointer)0x0;
      index._M_string_length = index._M_string_length & 0xffffffffffffff00;
      do {
        do {
          do {
            do {
              cVar7 = std::ios::widen((char)*(undefined8 *)((long)local_530 + -0x18) +
                                      (char)(istream *)local_530);
              piVar12 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                  ((istream *)local_530,(string *)local_f0,cVar7);
              if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) != 0) {
                if (local_f0 != (undefined1  [8])&index._M_string_length) {
                  operator_delete((void *)local_f0);
                }
                goto LAB_0012c692;
              }
              local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1c8,local_f0,index._M_dataplus._M_p + (long)local_f0);
              trimSpaces((string *)local_80,&local_1c8);
              std::__cxx11::string::operator=((string *)local_f0,(string *)local_80);
              if (local_80 != (undefined1  [8])&def._M_string_length) {
                operator_delete((void *)local_80);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                operator_delete(local_1c8._M_dataplus._M_p);
              }
              lVar11 = std::__cxx11::string::find((char *)local_f0,0x1352c2,0);
            } while ((lVar11 == 0) ||
                    (lVar11 = std::__cxx11::string::find
                                        ((char *)local_f0,(ulong)(arg->_M_dataplus)._M_p,0),
                    lVar11 == -1));
            std::__cxx11::string::find((char *)local_f0,(ulong)(arg->_M_dataplus)._M_p,0);
            std::__cxx11::string::substr((ulong)local_80,(ulong)local_f0);
            std::__cxx11::string::operator=((string *)local_f0,(string *)local_80);
            if (local_80 != (undefined1  [8])&def._M_string_length) {
              operator_delete((void *)local_80);
            }
            lVar11 = std::__cxx11::string::find((char *)local_f0,0x13675b,0);
          } while (lVar11 == -1);
          std::__cxx11::string::find((char *)local_f0,0x13675b,0);
          std::__cxx11::string::substr((ulong)local_80,(ulong)local_f0);
          std::__cxx11::string::operator=((string *)local_f0,(string *)local_80);
          if (local_80 != (undefined1  [8])&def._M_string_length) {
            operator_delete((void *)local_80);
          }
          lVar11 = std::__cxx11::string::find((char *)local_f0,0x1361a9,0);
        } while (lVar11 == -1);
        std::__cxx11::string::find((char *)local_f0,0x1361a9,0);
        std::__cxx11::string::substr((ulong)local_80,(ulong)local_f0);
        std::__cxx11::string::operator=((string *)local_f0,(string *)local_80);
        if (local_80 != (undefined1  [8])&def._M_string_length) {
          operator_delete((void *)local_80);
        }
        lVar11 = std::__cxx11::string::find((char *)local_f0,0x135972,0);
      } while (lVar11 == -1);
      std::ifstream::close();
      readQuote((string *)local_80,(string *)local_f0);
      if (def._M_dataplus._M_p != (pointer)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)local_80);
      }
      if (local_80 != (undefined1  [8])&def._M_string_length) {
        operator_delete((void *)local_80);
      }
      if (local_f0 != (undefined1  [8])&index._M_string_length) {
        operator_delete((void *)local_f0);
      }
      uVar21 = 1;
      bVar27 = false;
    }
    std::ifstream::~ifstream(local_530);
  }
  else {
    iVar8 = std::__cxx11::string::find((char *)arg,0x1354dd,0);
    iVar9 = std::__cxx11::string::find((char *)arg,0x135b5c,0);
    std::__cxx11::string::substr((ulong)&local_328,(ulong)arg);
    trimSpaces((string *)local_f0,&local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p);
    }
    if ((iVar8 + 1 == iVar9) || (index._M_dataplus._M_p == (pointer)0x0)) {
      local_80 = (undefined1  [8])&def._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,*(long *)line.field_2._8_8_,
                 *(long *)(line.field_2._8_8_ + 8) + *(long *)line.field_2._8_8_);
      std::__cxx11::string::append(local_80);
      plVar13 = (long *)std::__cxx11::string::_M_append(local_80,(ulong)(arg->_M_dataplus)._M_p);
      psVar14 = (size_type *)(plVar13 + 2);
      if ((size_type *)*plVar13 == psVar14) {
        val._M_string_length = *psVar14;
        val.field_2._M_allocated_capacity = plVar13[3];
        local_530 = (undefined1  [8])&val._M_string_length;
      }
      else {
        val._M_string_length = *psVar14;
        local_530 = (undefined1  [8])*plVar13;
      }
      val._M_dataplus._M_p = (pointer)plVar13[1];
      *plVar13 = (long)psVar14;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::append(local_530);
      plVar18 = plVar13 + 2;
      if ((long *)*plVar13 == plVar18) {
        uVar28 = (undefined4)*plVar18;
        uVar29 = *(undefined4 *)((long)plVar13 + 0x14);
        local_2b8 = *plVar18;
        uStack_2b0 = (undefined4)plVar13[3];
        uStack_2ac = *(undefined4 *)((long)plVar13 + 0x1c);
        local_2c8 = &local_2b8;
      }
      else {
        local_2b8 = *plVar18;
        uVar28 = extraout_XMM0_Da;
        uVar29 = extraout_XMM0_Db;
        local_2c8 = (long *)*plVar13;
      }
      local_2c0 = plVar13[1];
      *plVar13 = (long)plVar18;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      log((double)CONCAT44(uVar29,uVar28));
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8);
      }
      if (local_530 != (undefined1  [8])&val._M_string_length) {
        operator_delete((void *)local_530);
      }
      if (local_80 != (undefined1  [8])&def._M_string_length) {
        operator_delete((void *)local_80);
      }
      uVar21 = 1;
      bVar27 = false;
    }
    else {
      bVar27 = true;
      pcVar23 = (pointer)0x0;
      do {
        if (9 < (int)pcVar23[(long)local_f0] - 0x30U) {
          bVar27 = false;
        }
        pcVar23 = pcVar23 + 1;
      } while (index._M_dataplus._M_p != pcVar23);
      uVar24 = 0xffffffffffffffff;
      if (bVar27) {
        iVar8 = atoi((char *)local_f0);
        uVar24 = (ulong)iVar8;
      }
      std::__cxx11::string::find((char *)arg,0x1354dd,0);
      std::__cxx11::string::substr((ulong)local_80,(ulong)arg);
      auStack_118 = (undefined1  [8])0x0;
      arr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      arr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::ifstream::ifstream(local_530,(string *)fname,_S_in);
      cVar7 = std::__basic_file<char>::is_open();
      if (cVar7 != '\0') {
        local_b0 = (undefined1  [8])&line._M_string_length;
        line._M_dataplus._M_p = (pointer)0x0;
        line._M_string_length = line._M_string_length & 0xffffffffffffff00;
        local_120 = 0;
        psVar1 = (string *)(&def.field_2._M_allocated_capacity + 1);
        local_128 = uVar24;
LAB_0012ba92:
        do {
          do {
            cVar7 = std::ios::widen((char)*(undefined8 *)((long)local_530 + -0x18) +
                                    (char)(istream *)local_530);
            piVar12 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)local_530,(string *)local_b0,cVar7);
            if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) != 0)
            goto LAB_0012be73;
            local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_208,local_b0,line._M_dataplus._M_p + (long)local_b0);
            trimSpaces(psVar1,&local_208);
            std::__cxx11::string::operator=((string *)local_b0,(string *)psVar1);
            if ((size_type *)def.field_2._8_8_ != &element._M_string_length) {
              operator_delete((void *)def.field_2._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p);
            }
            lVar11 = std::__cxx11::string::find((char *)local_b0,0x1352c2,0);
          } while (lVar11 == 0);
          if ((local_120 & 1) == 0) {
            lVar11 = std::__cxx11::string::find((char *)local_b0,(ulong)local_80,0);
            if (lVar11 == -1) goto LAB_0012ba92;
            std::__cxx11::string::find((char *)local_b0,(ulong)local_80,0);
            std::__cxx11::string::substr((ulong)psVar1,(ulong)local_b0);
            std::__cxx11::string::operator=((string *)local_b0,(string *)psVar1);
            if ((size_type *)def.field_2._8_8_ != &element._M_string_length) {
              operator_delete((void *)def.field_2._8_8_);
            }
            lVar11 = std::__cxx11::string::find((char *)local_b0,0x13675b,0);
            if (lVar11 == -1) goto LAB_0012ba92;
            std::__cxx11::string::find((char *)local_b0,0x13675b,0);
            std::__cxx11::string::substr((ulong)psVar1,(ulong)local_b0);
            std::__cxx11::string::operator=((string *)local_b0,(string *)psVar1);
            if ((size_type *)def.field_2._8_8_ != &element._M_string_length) {
              operator_delete((void *)def.field_2._8_8_);
            }
            uVar17 = 0;
            lVar11 = std::__cxx11::string::find((char *)local_b0,0x13635a,0);
            local_120 = CONCAT71((int7)((ulong)uVar17 >> 8),1);
            if (lVar11 == -1) {
              std::__cxx11::string::find((char *)local_b0,0x13635a,0);
              std::__cxx11::string::substr((ulong)psVar1,(ulong)local_b0);
              std::__cxx11::string::operator=((string *)local_b0,(string *)psVar1);
              if ((size_type *)def.field_2._8_8_ != &element._M_string_length) {
                operator_delete((void *)def.field_2._8_8_);
              }
            }
          }
          if ((local_120 & 1) == 0) goto LAB_0012ba92;
          lVar11 = std::__cxx11::string::find((char *)local_b0,0x13635a,0);
          if (lVar11 == -1) {
            std::__cxx11::string::find((char *)local_b0,0x13635a,0);
            std::__cxx11::string::substr((ulong)psVar1,(ulong)local_b0);
            std::__cxx11::string::operator=((string *)local_b0,(string *)psVar1);
            if ((size_type *)def.field_2._8_8_ != &element._M_string_length) {
              operator_delete((void *)def.field_2._8_8_);
            }
          }
          do {
            readQuote(psVar1,(string *)local_b0);
            _Var5 = element._M_dataplus;
            if (element._M_dataplus._M_p != (pointer)0x0) {
              std::__cxx11::string::find((char *)local_b0,0x135972,0);
              psVar2 = (string *)(&index.field_2._M_allocated_capacity + 1);
              std::__cxx11::string::substr((ulong)psVar2,(ulong)local_b0);
              std::__cxx11::string::operator=((string *)local_b0,psVar2);
              if ((ulong *)index.field_2._8_8_ != &stack0xffffffffffffff40) {
                operator_delete((void *)index.field_2._8_8_);
              }
              std::__cxx11::string::find((char *)local_b0,0x135972,0);
              std::__cxx11::string::substr((ulong)psVar2,(ulong)local_b0);
              std::__cxx11::string::operator=((string *)local_b0,psVar2);
              if ((ulong *)index.field_2._8_8_ != &stack0xffffffffffffff40) {
                operator_delete((void *)index.field_2._8_8_);
              }
              std::__cxx11::string::find((char *)local_b0,0x136700,0);
              std::__cxx11::string::substr((ulong)psVar2,(ulong)local_b0);
              std::__cxx11::string::operator=((string *)local_b0,psVar2);
              if ((ulong *)index.field_2._8_8_ != &stack0xffffffffffffff40) {
                operator_delete((void *)index.field_2._8_8_);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_118,psVar1);
            }
            if ((size_type *)def.field_2._8_8_ != &element._M_string_length) {
              operator_delete((void *)def.field_2._8_8_);
            }
          } while (_Var5._M_p != (pointer)0x0);
          lVar11 = std::__cxx11::string::find((char *)local_b0,0x1361a9,0);
        } while (lVar11 == -1);
LAB_0012be73:
        uVar24 = local_128;
        if (local_b0 != (undefined1  [8])&line._M_string_length) {
          operator_delete((void *)local_b0);
          uVar24 = local_128;
        }
      }
      std::ifstream::close();
      pbVar19 = arr.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      auVar4 = auStack_118;
      lVar11 = (long)arr.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_118;
      uVar21 = (ulong)(lVar11 != 0);
      if (lVar11 == 0) {
        def.field_2._8_8_ = &element._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)((long)&def.field_2 + 8),*(long *)line.field_2._8_8_,
                   *(long *)(line.field_2._8_8_ + 8) + *(long *)line.field_2._8_8_);
        std::__cxx11::string::append(def.field_2._M_local_buf + 8);
        plVar13 = (long *)std::__cxx11::string::_M_append
                                    (def.field_2._M_local_buf + 8,(ulong)(arg->_M_dataplus)._M_p);
        psVar14 = (size_type *)(plVar13 + 2);
        if ((size_type *)*plVar13 == psVar14) {
          line._M_string_length = *psVar14;
          line.field_2._M_allocated_capacity = plVar13[3];
          local_b0 = (undefined1  [8])&line._M_string_length;
        }
        else {
          line._M_string_length = *psVar14;
          local_b0 = (undefined1  [8])*plVar13;
        }
        line._M_dataplus._M_p = (pointer)plVar13[1];
        *plVar13 = (long)psVar14;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append(local_b0);
        plVar18 = plVar13 + 2;
        if ((long *)*plVar13 == plVar18) {
          uVar28 = (undefined4)*plVar18;
          uVar29 = *(undefined4 *)((long)plVar13 + 0x14);
          local_298 = *plVar18;
          uStack_290 = (undefined4)plVar13[3];
          uStack_28c = *(undefined4 *)((long)plVar13 + 0x1c);
          local_2a8 = &local_298;
        }
        else {
          local_298 = *plVar18;
          uVar28 = extraout_XMM0_Da_05;
          uVar29 = extraout_XMM0_Db_05;
          local_2a8 = (long *)*plVar13;
        }
        local_2a0 = plVar13[1];
        *plVar13 = (long)plVar18;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        log((double)CONCAT44(uVar29,uVar28));
        if (local_2a8 != &local_298) {
          operator_delete(local_2a8);
        }
        if (local_b0 != (undefined1  [8])&line._M_string_length) {
          operator_delete((void *)local_b0);
        }
        if ((size_type *)def.field_2._8_8_ != &element._M_string_length) {
          operator_delete((void *)def.field_2._8_8_);
        }
      }
      else if (uVar24 < (ulong)(lVar11 >> 5)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)((long)auStack_118 + uVar24 * 0x20));
      }
      else if ((undefined1  [8])
               arr.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start != auStack_118) {
        lVar11 = 0;
        uVar24 = 0;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,(value_type *)((long)auStack_118 + lVar11));
          uVar24 = uVar24 + 1;
          lVar11 = lVar11 + 0x20;
        } while (uVar24 < (ulong)((long)arr.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start -
                                  (long)auStack_118 >> 5));
      }
      bVar27 = (undefined1  [8])pbVar19 == auVar4;
      std::ifstream::~ifstream(local_530);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_118);
      if (local_80 != (undefined1  [8])&def._M_string_length) {
        operator_delete((void *)local_80);
      }
    }
    if (local_f0 != (undefined1  [8])&index._M_string_length) {
      operator_delete((void *)local_f0);
    }
  }
LAB_0012d2b9:
  if (bVar27) {
    return __return_storage_ptr__;
  }
LAB_0012d2be:
  if ((uVar21 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> parse_script_arg(string arg, string fname, string err)
{
	vector<string> ret;

	// parse weapon name from argument 1
	if (arg[0] == '"')
	{
		// It's a string. Easy!
		string val = readQuote(arg);
		if (val.length())
			ret.push_back(val);
		return ret;
	}
	else if (arg.find("[") != string::npos)
	{
		// an index into an array
		int open = arg.find("[");
		int close = arg.find("]");
		string index = trimSpaces(arg.substr(open, close));
		if (close == open+1 || index.length() == 0)
		{
			log(err + "\t Reason: array index couldn't be parsed from '" + arg + "'\n");
			return ret;
		}
		
		bool isNumber = true;
		int idx = -1;
		for (int i = 0; i < index.size(); i++)
			if (!isdigit(index[i]))
				isNumber = false;
		if (isNumber)
			idx = atoi(index.c_str());
		
		// Parse file for array definition
		string def = arg.substr(0, arg.find("["));
		vector<string> arr;
		ifstream file(fname);
		if (file.is_open())
		{
			int lineNum = 0;
			bool in_array = false;
			string line;
			while (getline(file, line))
			{
				lineNum++;

				line = trimSpaces(line);
				if (line.find("//") == 0)
					continue;

				if (!in_array)
				{
					if (line.find(def) == string::npos)
						continue;
					line = line.substr(line.find(def) + def.length());

					if (line.find("=") == string::npos)
						continue;
					line = line.substr(line.find("=") + 1);

					if (line.find("{") == string::npos)
						line = line.substr(line.find("{") + 1);

					in_array = true;
				}
				if (in_array)
				{
					if (line.find("{") == string::npos)
						line = line.substr(line.find("{") + 1);

					bool hasQuote = true;
					while(hasQuote)
					{
						string element = readQuote(line);
						if (element.length())
						{
							line = line.substr(line.find("\"") + 1);
							line = line.substr(line.find("\"") + 1);
							line = line.substr(line.find(",") + 1);
							arr.push_back(element);
						}
						else
							break;
					}

					if (line.find(";") != string::npos)
						break;
				}
				
			}
		}
		file.close();

		if (arr.size() > 0)
		{
			if (idx >= arr.size())
			{
				for (int i = 0; i < arr.size(); i++)
					ret.push_back(arr[i]);
				return ret;
			}
			else
			{
				ret.push_back(arr[idx]);
				return ret;
			}
		}

		log(err + "\t Reason: Failed to parse array definition for '" + arg + "\n");
	}
	else if (arg.find("(") != string::npos && arg.find(")") != string::npos)
	{
		// Uh oh. It's a function
		int open = arg.find("(");
		int close = arg.find(")");
		string params = trimSpaces(arg.substr(open, close));
		if (close != open+1 && params.length())
		{
			log(err + "\t Reason: function call '" + arg + "' has parameters\n");
			return ret;
		}
					
		string funcdef = "string " + arg.substr(0, arg.find("(") + 1);

		// Parse file for function definition
		// anything more complicated than { return "weapon_super"; } won't work
		ifstream file(fname);
		if (file.is_open())
		{
			int lineNum = 0;
			bool in_func_body = false;
			string line;
			while (getline(file, line))
			{
				lineNum++;

				line = trimSpaces(line);
				if (line.find("//") == 0)
					continue;

				if (line.find(funcdef) != string::npos)
					in_func_body = true;

				if (in_func_body)
				{
					int iret = line.find("return ");
					if (iret != string::npos)
					{
						line = line.substr(iret);
						int semi = line.find(";");
						if (semi == string::npos)
						{
							log(err + "\t Reason: Failed to parse return value for '" + arg + "' on line " + to_string(lineNum) + "\n");
							break;
						}
						line = trimSpaces(line.substr(0, semi));
						if (line.find("\"") == string::npos)
						{
							log(err + "\t Reason: Failed to parse return value for '" + arg + "' on line " + to_string(lineNum) + "\n");
							break;
						}
						file.close();

						string val = readQuote(line);
						if (val.length())
							ret.push_back(val);
						return ret;
					}
				}
			}
		}
		file.close();
		log(err + "\t Reason: Failed to parse function definition for '" + arg + "\n");
		return ret;
	}
	else // must be a variable
	{
		bool valid_var_name = true;
		for (int i = 0; i < arg.length(); i++)
		{
			if (!isalpha(arg[i]) && !isdigit(arg[i]) && arg[i] != '_' && arg[i] != ':')
			{
				valid_var_name = false;
				break;
			}
		}
		if (!valid_var_name)
		{
			log(err + "\t Reason: argument '" + arg + "' does not appear to be a string, variable, or function\n");
			return ret;
		}
		
		// Strip namespace from the variable name.
		// This will break if there's a different var with the same name assigned in the same file.
		// Ideally all scripts should be searched and the namespace should only be removed when
		// inside the namespace block. Anyway this is good enough for ressya_no_tabi.
		if (arg.find("::") != string::npos) {
			arg = arg.substr(arg.find("::")+2);
		}

		// Parse file for variable assignment
		// ...hopefully it's a global assigned at the top of the file
		ifstream file(fname);
		if (file.is_open())
		{
			int lineNum = 0;
			string line;
			while (getline(file, line))
			{
				lineNum++;

				line = trimSpaces(line);
				if (line.find("//") == 0)
					continue;

				if (line.find(arg) == string::npos)
					continue;
				line = line.substr(line.find(arg) + arg.length());

				if (line.find("=") == string::npos)
					continue;
				line = line.substr(line.find("=") + 1);

				if (line.find(";") == string::npos)
					continue;
				line = line.substr(0, line.find(";"));

				if (line.find("\"") == string::npos)
					continue;

				file.close();

				string val = readQuote(line);
				if (val.length())
					ret.push_back(val);
				return ret;
			}
		}
		file.close();
		log(err + "\t Reason: Failed to parse variable assignment for '" + arg + "\n");
	}

	return ret;
}